

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O0

sexp_conflict
sexp_string_contains
          (sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict x,sexp_conflict y,
          sexp_conflict start)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  char *pcVar3;
  int *in_RCX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  int *in_R8;
  ulong in_R9;
  char *res;
  sexp_conflict local_48;
  sexp_conflict local_8;
  
  if ((((ulong)in_RCX & 3) == 0) && (*in_RCX == 9)) {
    if ((((ulong)in_R8 & 3) == 0) && (*in_R8 == 9)) {
      if ((in_R9 & 7) == 2) {
        auVar1._8_8_ = (long)in_R9 >> 0x3f;
        auVar1._0_8_ = in_R9 & 0xfffffffffffffffd;
        if (*(ulong *)(in_RCX + 6) < SUB168(auVar1 / SEXT816(8),0)) {
          local_8 = (sexp_conflict)
                    sexp_user_exception(in_RDI,in_RSI,"string-contains: start out of range",in_R9);
        }
        else {
          auVar2._8_8_ = (long)in_R9 >> 0x3f;
          auVar2._0_8_ = in_R9 & 0xfffffffffffffffd;
          pcVar3 = strstr((char *)(*(long *)(in_RCX + 2) + 0x10 + *(long *)(in_RCX + 4) +
                                  SUB168(auVar2 / SEXT816(8),0)),
                          (char *)(*(long *)(in_R8 + 2) + 0x10 + *(long *)(in_R8 + 4)));
          if (pcVar3 == (char *)0x0) {
            local_48 = (sexp_conflict)0x3e;
          }
          else {
            local_48 = (sexp_conflict)
                       (((long)pcVar3 - (*(long *)(in_RCX + 2) + 0x10 + *(long *)(in_RCX + 4))) * 8
                       | 2);
          }
          local_8 = local_48;
        }
      }
      else {
        local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,0xf,in_R9);
      }
    }
    else {
      local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,9,in_R8);
    }
  }
  else {
    local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,9,in_RCX);
  }
  return local_8;
}

Assistant:

sexp sexp_string_contains (sexp ctx, sexp self, sexp_sint_t n, sexp x, sexp y, sexp start) {
  const char *res;
  sexp_assert_type(ctx, sexp_stringp, SEXP_STRING, x);
  sexp_assert_type(ctx, sexp_stringp, SEXP_STRING, y);
  sexp_assert_type(ctx, sexp_string_cursorp, SEXP_STRING_CURSOR, start);
  if (sexp_unbox_string_cursor(start) > sexp_string_size(x))
    return sexp_user_exception(ctx, self, "string-contains: start out of range", start);
  res = strstr(sexp_string_data(x) + sexp_unbox_string_cursor(start), sexp_string_data(y));
  return res ? sexp_make_string_cursor(res-sexp_string_data(x)) : SEXP_FALSE;
}